

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 float32_muladd_aarch64(float32 xa,float32 xb,float32 xc,int flags,float_status *s)

{
  float __x;
  float32 fVar1;
  ulong uVar2;
  float __z;
  bool bVar3;
  float fVar4;
  
  uVar2 = (ulong)xc;
  if ((s->float_exception_flags & 0x20) == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = s->float_rounding_mode == '\0';
  }
  if (((flags & 8U) == 0) && (bVar3)) {
    if (s->flush_inputs_to_zero != '\0') {
      if ((xa & 0x7fffffff) != 0 && (xa & 0x7f800000) == 0) {
        xa = xa & 0x80000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((xb & 0x7fffffff) != 0 && (xb & 0x7f800000) == 0) {
        xb = xb & 0x80000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((xc & 0x7fffffff) != 0 && (xc & 0x7f800000) == 0) {
        uVar2 = (ulong)(xc & 0x80000000);
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
    }
    xc = (float32)uVar2;
    if ((((ABS((float)xa) == 0.0) || (((xa >> 0x17) + 1 & 0xfe) != 0)) &&
        ((ABS((float)xb) == 0.0 || (((xb >> 0x17) + 1 & 0xfe) != 0)))) &&
       (((uVar2 & 0x7fffffff) == 0 || (((int)(uVar2 >> 0x17) + 1U & 0xfe) != 0)))) {
      if (ABS((float)xa) == 0.0 || ABS((float)xb) == 0.0) {
        if (SUB41((flags & 2U) >> 1,0) == (int)(xb ^ xa) < 0) {
          fVar4 = 0.0;
        }
        else {
          fVar4 = -0.0;
        }
        if ((flags & 1U) != 0) {
          xc = (float32)-(float)xc;
        }
        fVar4 = (float)xc + fVar4;
      }
      else {
        __x = -(float)xa;
        if ((flags & 2U) == 0) {
          __x = (float)xa;
        }
        __z = -(float)xc;
        if ((flags & 1U) == 0) {
          __z = (float)xc;
        }
        fVar4 = fmaf(__x,(float)xb,__z);
        if (ABS(fVar4) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
          bVar3 = true;
        }
        else {
          bVar3 = true;
          if (ABS(fVar4) <= 1.1754944e-38) {
            bVar3 = false;
            __x = (float)xa;
            __z = (float)xc;
          }
        }
        xc = (float32)__z;
        xa = (float32)__x;
        if (!bVar3) goto LAB_00494623;
      }
      if ((flags & 4U) != 0) {
        fVar4 = (float)((uint)fVar4 ^ (uint)DAT_00d62ff0);
      }
      return (float32)fVar4;
    }
  }
LAB_00494623:
  fVar1 = soft_f32_muladd(xa,xb,xc,flags,s);
  return fVar1;
}

Assistant:

float32 QEMU_FLATTEN
float32_muladd(float32 xa, float32 xb, float32 xc, int flags, float_status *s)
{
    union_float32 ua, ub, uc, ur;

    ua.s = xa;
    ub.s = xb;
    uc.s = xc;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }
    if (unlikely(flags & float_muladd_halve_result)) {
        goto soft;
    }

    float32_input_flush3(&ua.s, &ub.s, &uc.s, s);
    if (unlikely(!f32_is_zon3(ua, ub, uc))) {
        goto soft;
    }

    if (unlikely(force_soft_fma)) {
        goto soft;
    }

    /*
     * When (a || b) == 0, there's no need to check for under/over flow,
     * since we know the addend is (normal || 0) and the product is 0.
     */
    if (float32_is_zero(ua.s) || float32_is_zero(ub.s)) {
        union_float32 up;
        bool prod_sign;

        prod_sign = float32_is_neg(ua.s) ^ float32_is_neg(ub.s);
        prod_sign ^= !!(flags & float_muladd_negate_product);
        up.s = float32_set_sign(float32_zero, prod_sign);

        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }
        ur.h = up.h + uc.h;
    } else {
        union_float32 ua_orig = ua;
        union_float32 uc_orig = uc;

        if (flags & float_muladd_negate_product) {
            ua.h = -ua.h;
        }
        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }

        ur.h = fmaf(ua.h, ub.h, uc.h);

        if (unlikely(f32_is_inf(ur))) {
            s->float_exception_flags |= float_flag_overflow;
        } else if (unlikely(fabsf(ur.h) <= FLT_MIN)) {
            ua = ua_orig;
            uc = uc_orig;
            goto soft;
        }
    }
    if (flags & float_muladd_negate_result) {
        return float32_chs(ur.s);
    }
    return ur.s;

 soft:
    return soft_f32_muladd(ua.s, ub.s, uc.s, flags, s);
}